

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O2

void av1_subtract_plane(MACROBLOCK *x,BLOCK_SIZE plane_bsize,int plane)

{
  ulong uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = CONCAT71(in_register_00000031,plane_bsize) & 0xffffffff;
  av1_subtract_block((BitDepthInfo)
                     (CONCAT44((uint)((x->e_mbd).cur_buf)->flags >> 3,(x->e_mbd).bd) & 0x1ffffffff),
                     (uint)block_size_high[uVar1],(uint)block_size_wide[uVar1],
                     x->plane[plane].src_diff,(ulong)block_size_wide[uVar1],x->plane[plane].src.buf,
                     (long)x->plane[plane].src.stride,(x->e_mbd).plane[plane].dst.buf,
                     (long)(x->e_mbd).plane[plane].dst.stride);
  return;
}

Assistant:

void av1_subtract_plane(MACROBLOCK *x, BLOCK_SIZE plane_bsize, int plane) {
  struct macroblock_plane *const p = &x->plane[plane];
  const struct macroblockd_plane *const pd = &x->e_mbd.plane[plane];
  assert(plane_bsize < BLOCK_SIZES_ALL);
  const int bw = block_size_wide[plane_bsize];
  const int bh = block_size_high[plane_bsize];
  const MACROBLOCKD *xd = &x->e_mbd;
  const BitDepthInfo bd_info = get_bit_depth_info(xd);

  av1_subtract_block(bd_info, bh, bw, p->src_diff, bw, p->src.buf,
                     p->src.stride, pd->dst.buf, pd->dst.stride);
}